

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockFailure.cpp
# Opt level: O3

void __thiscall
MockFailure::addExpectationsAndCallHistoryRelatedTo
          (MockFailure *this,SimpleString *name,MockExpectedCallsList *expectations)

{
  SimpleString *this_00;
  MockExpectedCallsList expectationsForFunction;
  SimpleString local_50;
  MockExpectedCallsList local_40;
  MockExpectedCallsList local_30;
  
  MockExpectedCallsList::MockExpectedCallsList(&local_30);
  MockExpectedCallsList::addExpectationsRelatedTo(&local_30,name,expectations);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator+=(this_00,"\tEXPECTED calls that WERE NOT fulfilled related to function: ")
  ;
  SimpleString::operator+=(this_00,name);
  SimpleString::operator+=(this_00,"\n");
  SimpleString::SimpleString(&local_50,"\t\t");
  MockExpectedCallsList::unfulfilledCallsToString(&local_40,(SimpleString *)&local_30);
  SimpleString::operator+=(this_00,(SimpleString *)&local_40);
  SimpleString::~SimpleString((SimpleString *)&local_40);
  SimpleString::~SimpleString(&local_50);
  SimpleString::operator+=(this_00,"\n\tEXPECTED calls that WERE fulfilled related to function: ");
  SimpleString::operator+=(this_00,name);
  SimpleString::operator+=(this_00,"\n");
  SimpleString::SimpleString(&local_50,"\t\t");
  MockExpectedCallsList::fulfilledCallsToString(&local_40,(SimpleString *)&local_30);
  SimpleString::operator+=(this_00,(SimpleString *)&local_40);
  SimpleString::~SimpleString((SimpleString *)&local_40);
  SimpleString::~SimpleString(&local_50);
  MockExpectedCallsList::~MockExpectedCallsList(&local_30);
  return;
}

Assistant:

void MockFailure::addExpectationsAndCallHistoryRelatedTo(const SimpleString& name, const MockExpectedCallsList& expectations)
{
    MockExpectedCallsList expectationsForFunction;
    expectationsForFunction.addExpectationsRelatedTo(name, expectations);

    message_ += "\tEXPECTED calls that WERE NOT fulfilled related to function: ";
    message_ += name;
    message_ += "\n";

    message_ += expectationsForFunction.unfulfilledCallsToString("\t\t");

    message_ += "\n\tEXPECTED calls that WERE fulfilled related to function: ";
    message_ += name;
    message_ += "\n";

    message_ += expectationsForFunction.fulfilledCallsToString("\t\t");
}